

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool find_solution(int step,int R,int G,int L,int S,int X,bool jumped,
                  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *solution)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  int iVar3;
  bool bVar4;
  _List_node_base *p_Var5;
  long lVar6;
  char *pcVar7;
  undefined4 in_register_0000003c;
  undefined8 uVar8;
  value_type local_58;
  undefined8 local_38;
  
  uVar8 = CONCAT44(in_register_0000003c,step);
  iVar3 = G + R;
  if ((X < iVar3 && R <= X) || (S < 0 || L + iVar3 <= X)) {
    return false;
  }
  if (((S == 0) && (iVar3 < X)) && (jumped)) {
    return true;
  }
  if (((G + 1 < S && 0 < S || jumped) && ((R <= X || (X + S + -1 <= iVar3)))) &&
     (local_38 = uVar8, bVar4 = find_solution(step + 1,R,G,L,S + -1,S + X + -1,jumped,solution),
     uVar8 = local_38, bVar4)) {
    paVar1 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"SLOW","");
    p_Var5 = (_List_node_base *)operator_new(0x30);
    p_Var5[1]._M_next = p_Var5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar1) {
      p_Var5[2]._M_next =
           (_List_node_base *)
           CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
      p_Var5[2]._M_prev = (_List_node_base *)local_58.field_2._8_8_;
    }
    else {
      p_Var5[1]._M_next = (_List_node_base *)local_58._M_dataplus._M_p;
      p_Var5[2]._M_next =
           (_List_node_base *)
           CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
    }
    p_Var5[1]._M_prev = (_List_node_base *)local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar2 = &(solution->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"SLOW",4);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    return true;
  }
  if (((S == 0) || (iVar3 <= X + S && X < R)) ||
     (local_38 = uVar8, bVar4 = find_solution((int)uVar8 + 1,R,G,L,S,X + S,jumped,solution),
     uVar8 = local_38, !bVar4)) {
    if ((S <= G) &&
       (((R <= X || (X + S + 1 < iVar3)) &&
        (local_38 = uVar8,
        bVar4 = find_solution((int)uVar8 + 1,R,G,L,S + 1,S + X + 1,jumped,solution),
        uVar8 = local_38, bVar4)))) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"SPEED","");
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_front(solution,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      pcVar7 = "SPEED";
      lVar6 = 5;
      goto LAB_001025f4;
    }
    if (R + -1 != X || S < 1) {
      return false;
    }
    bVar4 = find_solution((int)uVar8 + 1,R,G,L,S,X + S,true,solution);
    if (!bVar4) {
      return false;
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"JUMP","");
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_front(solution,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    pcVar7 = "JUMP";
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"WAIT","");
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_front(solution,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    pcVar7 = "WAIT";
  }
  lVar6 = 4;
LAB_001025f4:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar6);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  return true;
}

Assistant:

bool find_solution(int step, int R, int G, int L, int S, int X, bool jumped, std::list<std::string>& solution)
{
    //pad(step);
    //std::cerr << "step #" << step + 1 << std::endl;

    if ((X < R + G && X >= R)   // In down
        || X >= R + G + L       // Out of range
        || S < 0)               // Speed is negative
    {
        return false;
    }
    if (0 == S && R + G + L > X && X > R + G && jumped)
    {
        return true;
    }

    if (((0 < S && G + 1 < S) || jumped)
            && !(X < R && X + S - 1 > R + G))
    {
        //pad(step);
        //std::cerr << "Try SLOW: R == " << R << "; G == " << G << "; L == " << L << "; S == " << S << "; X == " << X << "; " << (jumped ? "already jumped" : "not jumped yet") << std::endl;
        if (find_solution(step + 1, R, G, L, S - 1, X + S - 1, jumped, solution))
        {
            solution.push_front("SLOW");
            std::cerr << "SLOW" << std::endl;
            return true;
        }
    }
    if (0 != S
            && !(X < R && X + S >= R + G))
    {
        //pad(step);
        //std::cerr << "Try WAIT: R == " << R << "; G == " << G << "; L == " << L << "; S == " << S << "; X == " << X << "; " << (jumped ? "already jumped" : "not jumped yet") << std::endl;
        if (find_solution(step + 1, R, G, L, S, X + S, jumped, solution))
        {
            solution.push_front("WAIT");
            std::cerr << "WAIT" << std::endl;
            return true;
        }
    }
    if (G + 1 > S
            && !(X < R && X + S + 1 >= R + G))
    {
        //pad(step);
        //std::cerr << "Try SPEED: R == " << R << "; G == " << G << "; L == " << L << "; S == " << S << "; X == " << X << "; " << (jumped ? "already jumped" : "not jumped yet") << std::endl;
        if (find_solution(step + 1, R, G, L, S + 1, X + S + 1, jumped, solution))
        {
            solution.push_front("SPEED");
            std::cerr << "SPEED" << std::endl;
            return true;
        }
    }
    if (0 < S
            && R - 1 == X)      // Try JUMP
    {
        //pad(step);
        //std::cerr << "Try JUMP: R == " << R << "; G == " << G << "; L == " << L << "; S == " << S << "; X == " << X << "; " << (jumped ? "already jumped" : "not jumped yet") << std::endl;
        if (find_solution(step + 1, R, G, L, S, X + S, true, solution))
        {
            solution.push_front("JUMP");
            std::cerr << "JUMP" << std::endl;
            return true;
        }
    }
    return false;
}